

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primeextractor.cpp
# Opt level: O0

void __thiscall PrimeExtractor::iterateVector(PrimeExtractor *this,long step)

{
  ulong uVar1;
  size_type sVar2;
  reference local_30;
  ulong local_20;
  long i;
  long step_local;
  PrimeExtractor *this_local;
  
  local_20 = this->lastStep + step;
  i = step;
  step_local = (long)this;
  while( true ) {
    uVar1 = local_20;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(&this->primeCand);
    if (sVar2 <= uVar1) break;
    local_30 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->primeCand,local_20);
    std::_Bit_reference::operator=(&local_30,false);
    local_20 = local_20 + i;
  }
  return;
}

Assistant:

void PrimeExtractor::iterateVector(long step)
{
  for(long i = this->lastStep + step; i < this->primeCand.size(); i = i + step) {
    this->primeCand[i] = false;
  }
  
}